

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int mtree_entry_create_virtual_dir(archive_write *a,char *pathname,mtree_entry_conflict **m_entry)

{
  int iVar1;
  archive_entry *entry_00;
  time_t t;
  long *in_RDX;
  archive *in_RDI;
  int r;
  mtree_entry_conflict *file;
  archive_entry *entry;
  char *in_stack_ffffffffffffffb8;
  archive_entry *in_stack_ffffffffffffffc0;
  long local_30;
  int local_4;
  
  entry_00 = archive_entry_new();
  if (entry_00 == (archive_entry *)0x0) {
    *in_RDX = 0;
    archive_set_error(in_RDI,0xc,"Can\'t allocate memory");
    local_4 = -0x1e;
  }
  else {
    archive_entry_copy_pathname(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    archive_entry_set_mode(entry_00,0x41ed);
    t = time((time_t *)0x0);
    archive_entry_set_mtime(entry_00,t,0);
    iVar1 = mtree_entry_new(a,(archive_entry *)pathname,m_entry);
    archive_entry_free((archive_entry *)0x2aeb1a);
    if (iVar1 < -0x14) {
      *in_RDX = 0;
      archive_set_error(in_RDI,0xc,"Can\'t allocate memory");
      local_4 = -0x1e;
    }
    else {
      *(undefined4 *)(*(long *)(local_30 + 0x28) + 0x28) = 1;
      *in_RDX = local_30;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int
mtree_entry_create_virtual_dir(struct archive_write *a, const char *pathname,
    struct mtree_entry **m_entry)
{
	struct archive_entry *entry;
	struct mtree_entry *file;
	int r;

	entry = archive_entry_new();
	if (entry == NULL) {
		*m_entry = NULL;
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	archive_entry_copy_pathname(entry, pathname);
	archive_entry_set_mode(entry, AE_IFDIR | 0755);
	archive_entry_set_mtime(entry, time(NULL), 0);

	r = mtree_entry_new(a, entry, &file);
	archive_entry_free(entry);
	if (r < ARCHIVE_WARN) {
		*m_entry = NULL;
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}

	file->dir_info->virtual = 1;

	*m_entry = file;
	return (ARCHIVE_OK);
}